

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

int __thiscall JsonTest::Runner::runCommandLine(Runner *this,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  reference pp_Var3;
  size_type sVar4;
  int iVar5;
  deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *this_00;
  uint unaff_R12D;
  allocator local_e5;
  int local_e4;
  deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *local_e0;
  uint testNameIndex;
  long local_d0;
  _Deque_iterator<JsonTest::TestCase_*(*)(),_JsonTest::TestCase_*(*&)(),_JsonTest::TestCase_*(**)()>
  *local_c8;
  string local_c0;
  string opt;
  Runner subrunner;
  
  local_e4 = argc;
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  _Deque_base((_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *)
              &subrunner);
  local_c8 = &(this->tests_).
              super__Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>
              ._M_impl.super__Deque_impl_data._M_start;
  iVar5 = 1;
  local_e0 = &this->tests_;
  do {
    if (local_e4 <= iVar5) {
      sVar4 = std::deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
              size(&subrunner.tests_);
      if ((int)sVar4 == 0) {
        bVar1 = true;
        this_00 = local_e0;
      }
      else {
        sVar4 = std::deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
                size(&subrunner.tests_);
        bVar1 = (sVar4 & 0xfffffffe) != 0;
        this_00 = &subrunner.tests_;
      }
      bVar1 = runAllTest((Runner *)this_00,bVar1);
      unaff_R12D = (uint)!bVar1;
      break;
    }
    std::__cxx11::string::string((string *)&opt,argv[iVar5],(allocator *)&local_c0);
    bVar1 = std::operator==(&opt,"--list-tests");
    if (bVar1) {
      unaff_R12D = 0;
      listTests((Runner *)local_e0);
      bVar2 = false;
    }
    else {
      bVar1 = std::operator==(&opt,"--test-auto");
      bVar2 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&opt,"--test");
        if ((bVar1) && (iVar5 = iVar5 + 1, iVar5 < local_e4)) {
          local_d0 = (long)iVar5;
          std::__cxx11::string::string((string *)&local_c0,argv[local_d0],&local_e5);
          bVar2 = testIndex((Runner *)local_e0,&local_c0,&testNameIndex);
          std::__cxx11::string::~string((string *)&local_c0);
          if (bVar2) {
            pp_Var3 = std::
                      _Deque_iterator<JsonTest::TestCase_*(*)(),_JsonTest::TestCase_*(*&)(),_JsonTest::TestCase_*(**)()>
                      ::operator[](local_c8,(ulong)testNameIndex);
            add(&subrunner,*pp_Var3);
            goto LAB_00122097;
          }
          fprintf(_stderr,"Test \'%s\' does not exist!\n",argv[local_d0]);
        }
        else {
          printUsage(*argv);
          bVar2 = false;
        }
        unaff_R12D = 2;
      }
    }
LAB_00122097:
    std::__cxx11::string::~string((string *)&opt);
    iVar5 = iVar5 + 1;
  } while (bVar2 != false);
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  ~_Deque_base((_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *
               )&subrunner);
  return unaff_R12D;
}

Assistant:

int Runner::runCommandLine(int argc, const char* argv[]) const {
  // typedef std::deque<std::string> TestNames;
  Runner subrunner;
  for (int index = 1; index < argc; ++index) {
    std::string opt = argv[index];
    if (opt == "--list-tests") {
      listTests();
      return 0;
    } else if (opt == "--test-auto") {
      preventDialogOnCrash();
    } else if (opt == "--test") {
      ++index;
      if (index < argc) {
        unsigned int testNameIndex;
        if (testIndex(argv[index], testNameIndex)) {
          subrunner.add(tests_[testNameIndex]);
        } else {
          fprintf(stderr, "Test '%s' does not exist!\n", argv[index]);
          return 2;
        }
      } else {
        printUsage(argv[0]);
        return 2;
      }
    } else {
      printUsage(argv[0]);
      return 2;
    }
  }
  bool succeeded;
  if (subrunner.testCount() > 0) {
    succeeded = subrunner.runAllTest(subrunner.testCount() > 1);
  } else {
    succeeded = runAllTest(true);
  }
  return succeeded ? 0 : 1;
}